

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliqueFinder.hpp
# Opt level: O0

uint FMB::CliqueFinder::findMaxCliqueSize
               (DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                *Ngraph)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  size_t sVar4;
  Stack<unsigned_int> *pSVar5;
  VirtualIterator<unsigned_int> *it;
  DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_RDI;
  Stack<unsigned_int> clique;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *ns;
  uint c_1;
  Iterator niter;
  uint left;
  uint i;
  uint size;
  DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *nbs;
  uint c;
  Iterator miter;
  DArray<Lib::Stack<unsigned_int>_> atleast;
  undefined4 in_stack_fffffffffffffeb8;
  uint in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  uint *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 uVar6;
  undefined1 in_stack_fffffffffffffed7;
  Stack<unsigned_int> *in_stack_fffffffffffffee0;
  DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffee8;
  RefIterator local_80;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  DArray<Lib::Stack<unsigned_int>_> local_28;
  DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_10;
  uint local_4;
  
  local_10 = in_RDI;
  Lib::DArray<Lib::Stack<unsigned_int>_>::DArray
            ((DArray<Lib::Stack<unsigned_int>_> *)
             CONCAT17(in_stack_fffffffffffffed7,
                      CONCAT16(in_stack_fffffffffffffed6,
                               CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0))),
             (size_t)in_stack_fffffffffffffec8);
  Lib::
  DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::size(local_10);
  Lib::DArray<Lib::Stack<unsigned_int>_>::ensure
            ((DArray<Lib::Stack<unsigned_int>_> *)in_stack_fffffffffffffee8,
             (size_t)in_stack_fffffffffffffee0);
  Lib::
  DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::Iterator::Iterator
            ((Iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  while (bVar1 = Lib::
                 DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                 ::Iterator::hasNext((Iterator *)0x2c6f06), bVar1) {
    Lib::
    DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::Iterator::next((Iterator *)
                     CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,
                                       CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                                      )),in_stack_fffffffffffffec8,
                     (DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> **)
                     CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    for (local_64 = Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::size
                              ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x2c6f4b)
        ; local_64 != 0; local_64 = local_64 - 1) {
      Lib::DArray<Lib::Stack<unsigned_int>_>::operator[](&local_28,(ulong)local_64);
      Lib::Stack<unsigned_int>::push
                ((Stack<unsigned_int> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
    }
  }
  sVar4 = Lib::DArray<Lib::Stack<unsigned_int>_>::size(&local_28);
  local_68 = (uint)sVar4;
  do {
    while( true ) {
      local_68 = local_68 - 1;
      if (local_68 < 2) {
        local_4 = 1;
        local_6c = 1;
        goto LAB_002c737f;
      }
      pSVar5 = Lib::DArray<Lib::Stack<unsigned_int>_>::operator[](&local_28,(ulong)local_68);
      sVar4 = Lib::Stack<unsigned_int>::size(pSVar5);
      if (sVar4 == local_68 + 1) break;
      pSVar5 = Lib::DArray<Lib::Stack<unsigned_int>_>::operator[](&local_28,(ulong)local_68);
      sVar4 = Lib::Stack<unsigned_int>::size(pSVar5);
      if (local_68 + 1 < sVar4) {
        in_stack_fffffffffffffee8 =
             (DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
              *)Lib::DArray<Lib::Stack<unsigned_int>_>::operator[](&local_28,(ulong)local_68);
        in_stack_fffffffffffffee0 =
             (Stack<unsigned_int> *)
             Lib::Stack<unsigned_int>::size((Stack<unsigned_int> *)in_stack_fffffffffffffee8);
        local_70 = (uint)in_stack_fffffffffffffee0;
        Lib::DArray<Lib::Stack<unsigned_int>_>::operator[](&local_28,(ulong)local_68);
        Lib::Stack<unsigned_int>::Iterator::Iterator
                  ((Iterator *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (Stack<unsigned_int> *)
                   CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        while( true ) {
          uVar2 = Lib::Stack<unsigned_int>::RefIterator::hasNext(&local_80);
          bVar1 = local_68 + 1 <= local_70;
          uVar6 = (bool)uVar2 && bVar1;
          if (!(bool)uVar2 || !bVar1) break;
          uVar3 = Lib::Stack<unsigned_int>::Iterator::next((Iterator *)0x2c71c1);
          it = (VirtualIterator<unsigned_int> *)
               Lib::
               DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
               ::get((DHMap<unsigned_int,_Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
                      *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc);
          in_stack_fffffffffffffec4 =
               Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::size
                         ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x2c720a);
          if (in_stack_fffffffffffffec4 == local_68) {
            Lib::Stack<unsigned_int>::Stack
                      ((Stack<unsigned_int> *)
                       CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_fffffffffffffed4,uVar3))),
                       (size_t)it);
            Lib::DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::iterator
                      ((DHSet<unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                       CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
            Lib::Stack<unsigned_int>::loadFromIterator<Lib::VirtualIterator<unsigned_int>>
                      ((Stack<unsigned_int> *)
                       CONCAT17(uVar2,CONCAT16(uVar6,CONCAT24(in_stack_fffffffffffffed4,uVar3))),it)
            ;
            Lib::VirtualIterator<unsigned_int>::~VirtualIterator
                      ((VirtualIterator<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            Lib::Stack<unsigned_int>::push
                      ((Stack<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffebc);
            bVar1 = checkClique(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
            in_stack_fffffffffffffec0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffec0);
            if (bVar1) {
              local_4 = local_68 + 1;
            }
            else {
              local_70 = local_70 - 1;
            }
            local_6c = (uint)bVar1;
            Lib::Stack<unsigned_int>::~Stack
                      ((Stack<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            if (local_6c != 0) goto LAB_002c737f;
          }
        }
      }
    }
    Lib::DArray<Lib::Stack<unsigned_int>_>::operator[](&local_28,(ulong)local_68);
    bVar1 = checkClique(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  } while (!bVar1);
  local_4 = local_68 + 1;
  local_6c = 1;
LAB_002c737f:
  Lib::DArray<Lib::Stack<unsigned_int>_>::~DArray
            ((DArray<Lib::Stack<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  return local_4;
}

Assistant:

static unsigned findMaxCliqueSize(DHMap<unsigned,DHSet<unsigned>*>* Ngraph)
    {
      //std::cout << "findMaxCliqueSize with " << Ngraph->size() << std::endl;

      // at least stores the number of nodes with at least index neighbours
      DArray<Stack<unsigned>> atleast;
      atleast.ensure(Ngraph->size()+1); // the +1 is to protect against a self-loop sneaking in

      DHMap<unsigned,DHSet<unsigned>*>::Iterator miter(*Ngraph);
      while(miter.hasNext()){
        unsigned c;
        DHSet<unsigned>* nbs;
        miter.next(c,nbs);
        unsigned size = nbs->size();
        //std::cout << ">> " << c << ": " << size << std::endl;

        //DHSet<unsigned>::Iterator dit(*nbs);
        //while(dit.hasNext()){ std::cout << dit.next() << std::endl; }

        for(;size>0;size--){
          atleast[size].push(c);
        }
      }
      //std::cout << "Searching" << std::endl;

      for(unsigned i=atleast.size()-1;i>1;i--){
        // in this case we would expect atleast[i] to be the clique
        if(atleast[i].size() == i+1){
          //std::cout << "CASE 1" << std::endl;
          if(checkClique(Ngraph,atleast[i])){
            //std::cout << "FIND(A) max clique of " << (i+1) << std::endl;
            //for(unsigned j=0;j<atleast[i].size();j++){ std::cout << atleast[i][j] << " ";}; std::cout << std::endl;
            return i+1;
          }
        }
        // in this case atleast[i] may contain a clique but cannot be a clique itself
        // we need to look at subsets
        else if (atleast[i].size() > i+1){
          //std::cout << "CASE 2" << std::endl;
          unsigned left = atleast[i].size();
          Stack<unsigned>::Iterator niter(atleast[i]);
          while(niter.hasNext() && left >= i+1){
            unsigned c = niter.next();
            //std::cout << ">> " << c << std::endl;
            auto ns = Ngraph->get(c);
            if(ns->size()==i){
              Stack<unsigned> clique;
              clique.loadFromIterator(ns->iterator());
              clique.push(c);
              if(checkClique(Ngraph,clique)){
                //std::cout << "FIND(B) max clique of " << (i+1) << std::endl;
                return i+1;
              }
              left--;
            }
          }
          //std::cout << "In this case with " << std::left << " left" << std::endl;
        }
      }

      //for(unsigned i=1;i<atleast.size();i++){
      //  std::cout << i << ":"<< atleast[i].size() << std::endl; 
      //}
      return 1;
    }